

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnknownHandleManager.cpp
# Opt level: O3

void __thiscall
helics::UnknownHandleManager::processUnknowns
          (UnknownHandleManager *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_helics::InterfaceType,_std::pair<helics::GlobalHandle,_unsigned_short>)>
          *cfunc)

{
  _Hash_node_base *p_Var1;
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
  *__range1;
  undefined1 local_39;
  _Hash_node_base *local_38;
  undefined2 local_30;
  
  p_Var1 = (this->unknown_publications)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      local_38 = p_Var1[5]._M_nxt;
      local_30 = *(undefined2 *)&p_Var1[6]._M_nxt;
      local_39 = 0x70;
      if (*(long *)(cfunc + 0x10) == 0) goto LAB_00373ea6;
      (**(code **)(cfunc + 0x18))(cfunc,p_Var1 + 1,&local_39,&local_38);
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  p_Var1 = (this->unknown_endpoints)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      local_38 = p_Var1[5]._M_nxt;
      local_30 = *(undefined2 *)&p_Var1[6]._M_nxt;
      local_39 = 0x65;
      if (*(long *)(cfunc + 0x10) == 0) goto LAB_00373ea6;
      (**(code **)(cfunc + 0x18))(cfunc,p_Var1 + 1,&local_39,&local_38);
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  p_Var1 = (this->unknown_inputs)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      local_38 = p_Var1[5]._M_nxt;
      local_30 = *(undefined2 *)&p_Var1[6]._M_nxt;
      local_39 = 0x69;
      if (*(long *)(cfunc + 0x10) == 0) goto LAB_00373ea6;
      (**(code **)(cfunc + 0x18))(cfunc,p_Var1 + 1,&local_39,&local_38);
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  p_Var1 = (this->unknown_filters)._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      local_38 = p_Var1[5]._M_nxt;
      local_30 = *(undefined2 *)&p_Var1[6]._M_nxt;
      local_39 = 0x66;
      if (*(long *)(cfunc + 0x10) == 0) {
LAB_00373ea6:
        std::__throw_bad_function_call();
      }
      (**(code **)(cfunc + 0x18))(cfunc,p_Var1 + 1,&local_39,&local_38);
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void UnknownHandleManager::processUnknowns(
    const std::function<void(const std::string&, InterfaceType, TargetInfo)>& cfunc) const
{
    for (const auto& upub : unknown_publications) {
        cfunc(upub.first, InterfaceType::PUBLICATION, upub.second);
    }
    for (const auto& uept : unknown_endpoints) {
        cfunc(uept.first, InterfaceType::ENDPOINT, uept.second);
    }
    for (const auto& uinp : unknown_inputs) {
        cfunc(uinp.first, InterfaceType::INPUT, uinp.second);
    }
    for (const auto& ufilt : unknown_filters) {
        cfunc(ufilt.first, InterfaceType::FILTER, ufilt.second);
    }
}